

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O1

void __thiscall anon_unknown.dwarf_5e646::JSONParser::tokenError(JSONParser *this)

{
  byte bVar1;
  lex_state_e lVar2;
  bool bVar3;
  uint uVar4;
  runtime_error *prVar5;
  void *pvVar6;
  long *plVar7;
  char *pcVar8;
  ulong uVar9;
  size_type *psVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->done == true) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"JSON: premature end of input");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  lVar2 = this->lex_state;
  switch(lVar2) {
  case ls_alpha:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar12 = this->offset;
    uVar13 = -uVar12;
    if (0 < (long)uVar12) {
      uVar13 = uVar12;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar9 = uVar13;
      uVar4 = 4;
      do {
        uVar11 = uVar4;
        if (uVar9 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_001293ce;
        }
        if (uVar9 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_001293ce;
        }
        if (uVar9 < 10000) goto LAB_001293ce;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar4 = uVar11 + 4;
      } while (bVar3);
      uVar11 = uVar11 + 1;
    }
LAB_001293ce:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar11 - (char)((long)uVar12 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              (local_70._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar11,uVar13);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2641e2);
    local_90._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar10) {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90.field_2._8_8_ = plVar7[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar10;
    }
    local_90._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar10) {
      local_b0.field_2._M_allocated_capacity = *psVar10;
      local_b0.field_2._8_8_ = plVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pcVar8 = this->p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    local_50.field_2._M_local_buf[0] = *pcVar8;
    local_50._M_string_length = 1;
    local_50.field_2._M_local_buf[1] = '\0';
    std::operator+(&local_d0,&local_b0,&local_50);
    std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_string:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar12 = this->offset;
    uVar13 = -uVar12;
    if (0 < (long)uVar12) {
      uVar13 = uVar12;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar9 = uVar13;
      uVar4 = 4;
      do {
        uVar11 = uVar4;
        if (uVar9 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00129449;
        }
        if (uVar9 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00129449;
        }
        if (uVar9 < 10000) goto LAB_00129449;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar4 = uVar11 + 4;
      } while (bVar3);
      uVar11 = uVar11 + 1;
    }
LAB_00129449:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar11 - (char)((long)uVar12 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              (local_90._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar11,uVar13);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x2641e2);
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar10) {
      local_b0.field_2._M_allocated_capacity = *psVar10;
      local_b0.field_2._8_8_ = plVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar10;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_backslash:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar12 = this->offset;
    uVar13 = -uVar12;
    if (0 < (long)uVar12) {
      uVar13 = uVar12;
    }
    uVar11 = 1;
    if (9 < uVar13) {
      uVar9 = uVar13;
      uVar4 = 4;
      do {
        uVar11 = uVar4;
        if (uVar9 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_00129353;
        }
        if (uVar9 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_00129353;
        }
        if (uVar9 < 10000) goto LAB_00129353;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar4 = uVar11 + 4;
      } while (bVar3);
      uVar11 = uVar11 + 1;
    }
LAB_00129353:
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar11 - (char)((long)uVar12 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              (local_70._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar11,uVar13);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x2641e2);
    local_90._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_90._M_dataplus._M_p == psVar10) {
      local_90.field_2._M_allocated_capacity = *psVar10;
      local_90.field_2._8_8_ = plVar7[3];
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar10;
    }
    local_90._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar10) {
      local_b0.field_2._M_allocated_capacity = *psVar10;
      local_b0.field_2._8_8_ = plVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pcVar8 = this->p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    local_50.field_2._M_local_buf[0] = *pcVar8;
    local_50._M_string_length = 1;
    local_50.field_2._M_local_buf[1] = '\0';
    std::operator+(&local_d0,&local_b0,&local_50);
    std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  case ls_u4:
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    uVar13 = ~this->u_count + this->offset;
    uVar12 = -uVar13;
    if (0 < (long)uVar13) {
      uVar12 = uVar13;
    }
    uVar11 = 1;
    if (9 < uVar12) {
      uVar9 = uVar12;
      uVar4 = 4;
      do {
        uVar11 = uVar4;
        if (uVar9 < 100) {
          uVar11 = uVar11 - 2;
          goto LAB_001294c4;
        }
        if (uVar9 < 1000) {
          uVar11 = uVar11 - 1;
          goto LAB_001294c4;
        }
        if (uVar9 < 10000) goto LAB_001294c4;
        bVar3 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        uVar4 = uVar11 + 4;
      } while (bVar3);
      uVar11 = uVar11 + 1;
    }
LAB_001294c4:
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar11 - (char)((long)uVar13 >> 0x3f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_long_long>
              (local_90._M_dataplus._M_p + -((long)uVar13 >> 0x3f),uVar11,uVar12);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x2641e2);
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar10) {
      local_b0.field_2._M_allocated_capacity = *psVar10;
      local_b0.field_2._8_8_ = plVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_d0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
      local_d0.field_2._M_allocated_capacity = *psVar10;
      local_d0.field_2._8_8_ = plVar7[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar10;
    }
    local_d0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = *this->p;
  if (bVar1 < 0x20) {
    if (bVar1 - 9 < 5) goto LAB_0012919b;
  }
  else if (bVar1 < 0x2e) {
    if (bVar1 == 0x20) goto LAB_0012919b;
    if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar12 = this->offset;
      uVar13 = -uVar12;
      if (0 < (long)uVar12) {
        uVar13 = uVar12;
      }
      uVar11 = 1;
      if (9 < uVar13) {
        uVar9 = uVar13;
        uVar4 = 4;
        do {
          uVar11 = uVar4;
          if (uVar9 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00129983;
          }
          if (uVar9 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00129983;
          }
          if (uVar9 < 10000) goto LAB_00129983;
          bVar3 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          uVar4 = uVar11 + 4;
        } while (bVar3);
        uVar11 = uVar11 + 1;
      }
LAB_00129983:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_90,(char)uVar11 - (char)((long)uVar12 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                (local_90._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar11,uVar13);
      std::operator+(&local_b0,"JSON: offset ",&local_90);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar10;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if ((bVar1 == 0x65) || (bVar1 == 0x45)) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      uVar12 = this->offset;
      uVar13 = -uVar12;
      if (0 < (long)uVar12) {
        uVar13 = uVar12;
      }
      uVar11 = 1;
      if (9 < uVar13) {
        uVar9 = uVar13;
        uVar4 = 4;
        do {
          uVar11 = uVar4;
          if (uVar9 < 100) {
            uVar11 = uVar11 - 2;
            goto LAB_00129a0c;
          }
          if (uVar9 < 1000) {
            uVar11 = uVar11 - 1;
            goto LAB_00129a0c;
          }
          if (uVar9 < 10000) goto LAB_00129a0c;
          bVar3 = 99999 < uVar9;
          uVar9 = uVar9 / 10000;
          uVar4 = uVar11 + 4;
        } while (bVar3);
        uVar11 = uVar11 + 1;
      }
LAB_00129a0c:
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct
                ((ulong)&local_90,(char)uVar11 - (char)((long)uVar12 >> 0x3f));
      std::__detail::__to_chars_10_impl<unsigned_long_long>
                (local_90._M_dataplus._M_p + -((long)uVar12 >> 0x3f),uVar11,uVar13);
      std::operator+(&local_b0,"JSON: offset ",&local_90);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar10;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (bVar1 == 0x2e) {
      if ((lVar2 < ls_alpha) && ((0x182U >> (lVar2 & (ls_begin_dict|ls_end_array)) & 1) != 0)) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_90,this->offset);
        std::operator+(&local_b0,"JSON: offset ",&local_90);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
        local_d0._M_dataplus._M_p = (pointer)*plVar7;
        psVar10 = (size_type *)(plVar7 + 2);
        if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
          local_d0.field_2._M_allocated_capacity = *psVar10;
          local_d0.field_2._8_8_ = plVar7[3];
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        }
        else {
          local_d0.field_2._M_allocated_capacity = *psVar10;
        }
        local_d0._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::to_string(&local_90,this->offset);
      std::operator+(&local_b0,"JSON: offset ",&local_90);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
      local_d0._M_dataplus._M_p = (pointer)*plVar7;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0.field_2._8_8_ = plVar7[3];
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar10;
      }
      local_d0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  pvVar6 = memchr("{}[]:,",(int)(char)bVar1,7);
  if (pvVar6 == (void *)0x0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_70,this->offset);
    std::operator+(&local_90,"JSON: offset ",&local_70);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_90);
    local_b0._M_dataplus._M_p = (pointer)*plVar7;
    psVar10 = (size_type *)(plVar7 + 2);
    if ((size_type *)local_b0._M_dataplus._M_p == psVar10) {
      local_b0.field_2._M_allocated_capacity = *psVar10;
      local_b0.field_2._8_8_ = plVar7[3];
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    else {
      local_b0.field_2._M_allocated_capacity = *psVar10;
    }
    local_b0._M_string_length = plVar7[1];
    *plVar7 = (long)psVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    pcVar8 = this->p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)std::__throw_logic_error("basic_string::_M_construct null not valid");
    }
    local_50.field_2._M_local_buf[0] = *pcVar8;
    local_50._M_string_length = 1;
    local_50.field_2._M_local_buf[1] = '\0';
    std::operator+(&local_d0,&local_b0,&local_50);
    std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_0012919b:
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_90,this->offset);
  std::operator+(&local_b0,"JSON: offset ",&local_90);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_d0._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar10) {
    local_d0.field_2._M_allocated_capacity = *psVar10;
    local_d0.field_2._8_8_ = plVar7[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar10;
  }
  local_d0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::runtime_error::runtime_error(prVar5,(string *)&local_d0);
  __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
JSONParser::tokenError()
{
    if (done) {
        QTC::TC("libtests", "JSON parse ls premature end of input");
        throw std::runtime_error("JSON: premature end of input");
    }

    if (lex_state == ls_u4) {
        QTC::TC("libtests", "JSON parse bad hex after u");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset - u_count - 1) +
            ": \\u must be followed by four hex digits");
    } else if (lex_state == ls_alpha) {
        QTC::TC("libtests", "JSON parse keyword bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": keyword: unexpected character " +
            std::string(p, 1));
    } else if (lex_state == ls_string) {
        QTC::TC("libtests", "JSON parse control char in string");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) +
            ": control character in string (missing \"?)");
    } else if (lex_state == ls_backslash) {
        QTC::TC("libtests", "JSON parse backslash bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) +
            ": invalid character after backslash: " + std::string(p, 1));
    }

    if (*p == '.') {
        if (lex_state == ls_number || lex_state == ls_number_e || lex_state == ls_number_e_sign) {
            QTC::TC("libtests", "JSON parse point after e");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) +
                ": numeric literal: decimal point after e");
        } else {
            QTC::TC("libtests", "JSON parse duplicate point");
            throw std::runtime_error(
                "JSON: offset " + std::to_string(offset) +
                ": numeric literal: decimal point already seen");
        }
    } else if (*p == 'e' || *p == 'E') {
        QTC::TC("libtests", "JSON parse duplicate e");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: e already seen");
    } else if ((*p == '+') || (*p == '-')) {
        QTC::TC("libtests", "JSON parse unexpected sign");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: unexpected sign");
    } else if (util::is_space(*p) || strchr("{}[]:,", *p)) {
        QTC::TC("libtests", "JSON parse incomplete number");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: incomplete number");

    } else {
        QTC::TC("libtests", "JSON parse numeric bad character");
        throw std::runtime_error(
            "JSON: offset " + std::to_string(offset) + ": numeric literal: unexpected character " +
            std::string(p, 1));
    }
    throw std::logic_error("JSON::tokenError : unhandled error");
}